

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrobjs.c
# Opt level: O3

FT_Error pfr_face_init(FT_Stream stream,FT_Face pfrface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  byte *pbVar1;
  byte bVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  FT_Size memory;
  FT_String *pFVar6;
  uint uVar7;
  FT_Stream pFVar8;
  FT_ListNode pFVar9;
  long lVar10;
  FT_Long FVar11;
  FT_Face pFVar12;
  FT_UShort FVar13;
  ushort uVar14;
  FT_Error FVar15;
  FT_ULong FVar16;
  ushort *puVar17;
  FT_Bitmap_Size *pFVar18;
  FT_Pointer pvVar19;
  int iVar20;
  FT_String **astring;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ushort uVar24;
  ushort *puVar25;
  ulong uVar26;
  uint *puVar27;
  byte *pbVar28;
  FT_Long *pFVar29;
  FT_Face pFVar30;
  FT_Face pFVar31;
  uint uVar33;
  int *piVar32;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  FT_UInt count;
  ushort *puVar37;
  FT_Error error;
  FT_Error local_8c;
  FT_CharMapRec_ local_88;
  undefined8 local_78;
  FT_Face local_70;
  FT_Face local_68;
  FT_Error local_5c;
  undefined8 local_58;
  uint local_4c;
  ulong local_48;
  FT_String **local_40;
  FT_String **local_38;
  
  FVar15 = FT_Stream_Seek(stream,0);
  if (FVar15 != 0) {
    return FVar15;
  }
  FVar15 = FT_Stream_ReadFields(stream,pfr_header_fields,pfrface + 1);
  if (FVar15 != 0) {
    return FVar15;
  }
  FVar11 = pfrface[1].num_faces;
  piVar32 = (int *)((long)&pfrface[1].num_glyphs + 4);
  *piVar32 = *piVar32 + pfrface[1].num_charmaps * 0x10000;
  if ((int)FVar11 != 0x50465230) {
    return 2;
  }
  if (4 < *(uint *)((long)&pfrface[1].num_faces + 4)) {
    return 2;
  }
  if (*(uint *)((long)&pfrface[1].face_index + 4) < 0x3a) {
    return 2;
  }
  if ((int)pfrface[1].face_index != 0xd0a) {
    return 2;
  }
  uVar22 = (ulong)*(uint *)((long)&pfrface[1].face_flags + 4);
  local_88.face._0_4_ = FT_Stream_Seek(stream,uVar22);
  if ((FT_Error)local_88.face != 0) {
    return (FT_Error)local_88.face;
  }
  FVar13 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_88);
  if ((FT_Error)local_88.face != 0) {
    return (FT_Error)local_88.face;
  }
  if (0x3332 < FVar13) {
    return 8;
  }
  if (stream->size - uVar22 <= (ulong)((uint)FVar13 + (uint)FVar13 * 4 + 2)) {
    return 8;
  }
  if (stream->size <= (ulong)((((uint)FVar13 + (uint)FVar13 * 2) * 8 - (uint)FVar13) + 0x5f)) {
    return 8;
  }
  local_5c = 0;
  pfrface->num_faces = (ulong)(uint)FVar13;
  if (face_index < 0) {
    return 0;
  }
  uVar35 = face_index & 0xffff;
  if (FVar13 <= uVar35) {
    return 6;
  }
  iVar20 = pfrface[1].num_charmaps;
  local_88.face._0_4_ = FT_Stream_Seek(stream,(ulong)*(uint *)((long)&pfrface[1].face_flags + 4));
  if ((FT_Error)local_88.face != 0) {
    return (FT_Error)local_88.face;
  }
  FVar13 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_88);
  if ((FT_Error)local_88.face != 0) {
    return (FT_Error)local_88.face;
  }
  if (FVar13 <= uVar35) {
    return 6;
  }
  local_88.face._0_4_ = FT_Stream_Skip(stream,(ulong)(uVar35 * 5));
  if ((FT_Error)local_88.face != 0) {
    return (FT_Error)local_88.face;
  }
  FVar13 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_88);
  if ((FT_Error)local_88.face != 0) {
    return (FT_Error)local_88.face;
  }
  FVar16 = FT_Stream_ReadUOffset(stream,(FT_Error *)&local_88);
  if ((FT_Error)local_88.face != 0) {
    return (FT_Error)local_88.face;
  }
  uVar33 = (uint)FVar13;
  *(uint *)((long)&pfrface[1].bbox.xMin + 4) = uVar33;
  *(int *)&pfrface[1].bbox.yMin = (int)FVar16;
  local_88.face._0_4_ = FT_Stream_Seek(stream,FVar16 & 0xffffffff);
  if ((FT_Error)local_88.face != 0) {
    return (FT_Error)local_88.face;
  }
  FVar15 = FT_Stream_EnterFrame(stream,(ulong)uVar33);
  local_88.face = (FT_Face)CONCAT44(local_88.face._4_4_,FVar15);
  if (FVar15 != 0) {
    return FVar15;
  }
  if (FVar13 < 0xd) {
LAB_001488e2:
    local_88.face = (FT_Face)CONCAT44(local_88.face._4_4_,8);
  }
  else {
    pbVar28 = stream->cursor;
    puVar37 = (ushort *)(pbVar28 + uVar33);
    *(uint *)((long)&pfrface[1].bbox.yMin + 4) =
         (uint)pbVar28[2] | (uint)pbVar28[1] << 8 | (uint)*pbVar28 << 0x10;
    *(uint *)&pfrface[1].bbox.xMax =
         (uint)pbVar28[5] | (uint)pbVar28[4] << 8 | (uint)pbVar28[3] << 0x10;
    *(uint *)((long)&pfrface[1].bbox.xMax + 4) =
         (uint)pbVar28[8] | (uint)pbVar28[7] << 8 | (uint)pbVar28[6] << 0x10;
    *(uint *)&pfrface[1].bbox.yMax =
         (uint)pbVar28[0xb] | (uint)pbVar28[10] << 8 | (uint)pbVar28[9] << 0x10;
    puVar25 = (ushort *)(pbVar28 + 0xd);
    bVar2 = pbVar28[0xc];
    uVar33 = 0;
    if ((bVar2 & 4) != 0) {
      uVar36 = (uint)((bVar2 & 8) == 0);
      uVar33 = uVar36 ^ 5;
      if ((bVar2 & 3) != 0) {
        uVar33 = 2 - uVar36;
      }
    }
    if (puVar37 < (ushort *)
                  ((ulong)((2 - ((bVar2 & 0x20) == 0) & (int)((uint)bVar2 << 0x1b) >> 0x1f) + uVar33
                          ) + (long)puVar25)) goto LAB_001488e2;
    if ((bVar2 & 4) != 0) {
      uVar24 = *puVar25;
      uVar33 = (uint)(ushort)(byte)uVar24;
      if ((bVar2 & 8) == 0) {
        puVar25 = (ushort *)(pbVar28 + 0xe);
      }
      else {
        puVar25 = (ushort *)(pbVar28 + 0xf);
        uVar33 = (int)(short)((ushort)(byte)uVar24 << 8) | (uint)pbVar28[0xe];
      }
      pfrface[1].units_per_EM = (short)uVar33;
      pfrface[1].ascender = (short)(uVar33 >> 0x10);
      if ((bVar2 & 3) == 0) {
        uVar24 = *puVar25;
        pbVar28 = (byte *)((long)puVar25 + 1);
        puVar17 = puVar25 + 1;
        puVar25 = (ushort *)((long)puVar25 + 3);
        uVar33 = (uint)(byte)*puVar17 | (uint)*pbVar28 << 8 | (uint)(byte)uVar24 << 0x10;
        pfrface[1].max_advance_width = (short)uVar33;
        pfrface[1].max_advance_height = (short)(uVar33 >> 0x10);
      }
    }
    if ((bVar2 & 0x10) != 0) {
      uVar24 = *puVar25;
      uVar33 = (uint)(ushort)(byte)uVar24;
      if ((bVar2 & 0x20) == 0) {
        puVar25 = (ushort *)((long)puVar25 + 1);
      }
      else {
        pbVar28 = (byte *)((long)puVar25 + 1);
        puVar25 = puVar25 + 1;
        uVar33 = (int)(short)((ushort)(byte)uVar24 << 8) | (uint)*pbVar28;
      }
      pfrface[1].descender = (short)uVar33;
      pfrface[1].height = (short)(uVar33 >> 0x10);
    }
    puVar17 = puVar25;
    if ((bVar2 & 0x40) != 0) {
      puVar17 = (ushort *)((long)puVar25 + 1);
      if (puVar37 < puVar17) goto LAB_001488e2;
      uVar33 = (uint)(byte)*puVar25;
      if ((byte)*puVar25 != 0) {
        do {
          if ((puVar37 < puVar17 + 1) ||
             (puVar17 = (ushort *)((long)(puVar17 + 1) + (ulong)(byte)*puVar17), puVar37 < puVar17))
          goto LAB_001488e2;
          uVar33 = uVar33 - 1;
        } while (uVar33 != 0);
      }
      local_88.face = (FT_Face)((ulong)local_88.face._4_4_ << 0x20);
    }
    if (puVar37 < (ushort *)((long)puVar17 + 5U)) goto LAB_001488e2;
    uVar24 = *puVar17 << 8 | *puVar17 >> 8;
    pfrface[1].underline_position = (short)(uint)uVar24;
    pfrface[1].underline_thickness = (short)((uint)uVar24 >> 0x10);
    *(uint *)&pfrface[1].glyph =
         (uint)(byte)puVar17[2] |
         (uint)*(byte *)((long)puVar17 + 3) << 8 | (uint)(byte)puVar17[1] << 0x10;
    if (iVar20 != 0) {
      if (puVar37 < puVar17 + 3) goto LAB_001488e2;
      uVar33 = (uint)CONCAT12(*(byte *)((long)puVar17 + 5U),uVar24);
      pfrface[1].underline_position = (short)uVar33;
      pfrface[1].underline_thickness = (short)(uVar33 >> 0x10);
    }
  }
  FT_Stream_ExitFrame(stream);
  local_5c = (FT_Error)local_88.face;
  if ((FT_Error)local_88.face != 0) {
    return (FT_Error)local_88.face;
  }
  uVar33._0_2_ = pfrface[1].underline_position;
  uVar33._2_2_ = pfrface[1].underline_thickness;
  uVar36 = *(uint *)&pfrface[1].glyph;
  memory = (FT_Size)stream->memory;
  pfrface[1].size = memory;
  *(uint *)&pfrface[1].charmap = uVar36;
  pfrface[2].bbox.xMax = 0;
  pfrface[2].bbox.yMax = (FT_Pos)&pfrface[2].bbox.xMax;
  FVar15 = FT_Stream_Seek(stream,(ulong)uVar36);
  if (FVar15 != 0) {
    return FVar15;
  }
  local_8c = FT_Stream_EnterFrame(stream,(ulong)uVar33);
  if (local_8c != 0) {
    return local_8c;
  }
  local_70 = (FT_Face)stream->cursor;
  *(FT_Face *)&pfrface[2].max_advance_width = local_70;
  pFVar12 = local_88.face;
  if (uVar33 < 0xf) goto LAB_00148bf3;
  uVar24 = (ushort)local_70->num_faces;
  *(uint *)((long)&pfrface[1].charmap + 4) = (uint)(ushort)(uVar24 << 8 | uVar24 >> 8);
  uVar24 = *(ushort *)((long)&local_70->num_faces + 2);
  *(uint *)&pfrface[1].driver = (uint)(ushort)(uVar24 << 8 | uVar24 >> 8);
  uVar24 = *(ushort *)((long)&local_70->num_faces + 4);
  *(uint *)((long)&pfrface[1].driver + 4) = (uint)(ushort)(uVar24 << 8 | uVar24 >> 8);
  pfrface[1].memory =
       (FT_Memory)
       ((long)(short)((ushort)*(byte *)((long)&local_70->num_faces + 6) << 8) |
       (ulong)*(byte *)((long)&local_70->num_faces + 7));
  pfrface[1].stream =
       (FT_Stream)
       ((long)(short)((ushort)(byte)local_70->face_index << 8) |
       (ulong)*(byte *)((long)&local_70->face_index + 1));
  pfrface[1].sizes_list.head =
       (FT_ListNode)
       ((long)(short)((ushort)*(byte *)((long)&local_70->face_index + 2) << 8) |
       (ulong)*(byte *)((long)&local_70->face_index + 3));
  pfrface[1].sizes_list.tail =
       (FT_ListNode)
       ((long)(short)((ushort)*(byte *)((long)&local_70->face_index + 4) << 8) |
       (ulong)*(byte *)((long)&local_70->face_index + 5));
  local_88.face = (FT_Face)((long)&local_70->face_index + 7);
  bVar2 = *(byte *)((long)&local_70->face_index + 6);
  local_48 = (ulong)bVar2;
  *(uint *)&pfrface[1].autohint.data = (uint)bVar2;
  local_4c = bVar2 & 4;
  if ((bVar2 & 4) == 0) {
    pFVar12 = local_88.face;
    if (uVar33 < 0x11) goto LAB_00148bf3;
    local_88.face = (FT_Face)((long)&local_70->face_flags + 1);
    *(uint *)((long)&pfrface[1].autohint.data + 4) =
         (int)(short)((ushort)*(byte *)((long)&local_70->face_index + 7) << 8) |
         (uint)(byte)local_70->face_flags;
  }
  local_70 = (FT_Face)((long)&local_70->num_faces + (ulong)uVar33);
  FVar15 = 0;
  if (((char)bVar2 < '\0') &&
     (local_8c = pfr_extra_items_parse
                           ((FT_Byte **)&local_88,(FT_Byte *)local_70,pfr_phy_font_extra_items,
                            &pfrface[1].size), FVar15 = local_8c, local_8c != 0)) goto LAB_00148bfb;
  local_8c = FVar15;
  pFVar30 = (FT_Face)((long)&(local_88.face)->num_faces + 3);
  pFVar12 = local_88.face;
  if (local_70 < pFVar30) {
LAB_00148bf3:
    local_88.face = pFVar12;
    local_8c = 8;
  }
  else {
    local_78 = (FT_Face)((ulong)*(byte *)((long)&(local_88.face)->num_faces + 2) |
                        (ulong)((uint)*(byte *)((long)&(local_88.face)->num_faces + 1) << 8 |
                               (uint)(byte)(local_88.face)->num_faces << 0x10));
    pFVar31 = pFVar30;
    local_88.face = pFVar30;
    if (local_78 != (FT_Face)0x0) {
      local_88.face = (FT_Face)((long)&pFVar30->num_faces + (long)&local_78->num_faces);
      pFVar12 = pFVar30;
      local_68 = local_88.face;
      if (local_70 < local_88.face) goto LAB_00148bf3;
      local_38 = &pfrface[2].family_name;
      local_40 = (FT_String **)&pfrface[2].num_glyphs;
      do {
        pFVar12 = (FT_Face)((long)&pFVar30->num_faces + 4);
        pFVar31 = local_68;
        if (((local_68 < pFVar12) ||
            (uVar24 = (ushort)pFVar30->num_faces, uVar24 = uVar24 << 8 | uVar24 >> 8, uVar24 < 4))
           || (local_58 = (FT_Face)(ulong)uVar24, local_78 < local_58)) break;
        uVar14 = *(ushort *)((long)&pFVar30->num_faces + 2);
        uVar14 = uVar14 << 8 | uVar14 >> 8;
        astring = local_38;
        if (uVar14 == 3) {
LAB_00148b4e:
          local_8c = pfr_aux_name_load((FT_Byte *)pFVar12,uVar24 - 4,(FT_Memory)memory,astring);
          if (local_8c != 0) {
            return local_8c;
          }
        }
        else if (uVar14 == 2) {
          if (0x23 < uVar24) {
            *(uint *)&pfrface[1].autohint.finalizer =
                 (int)(short)((ushort)*(byte *)((long)&pFVar30->face_index + 6) << 8) |
                 (uint)*(byte *)((long)&pFVar30->face_index + 7);
            *(uint *)((long)&pfrface[1].autohint.finalizer + 4) =
                 (int)(short)((ushort)(byte)pFVar30->face_flags << 8) |
                 (uint)*(byte *)((long)&pFVar30->face_flags + 1);
            *(uint *)&pfrface[1].extensions =
                 (int)(short)((ushort)*(byte *)((long)&pFVar30->face_flags + 2) << 8) |
                 (uint)*(byte *)((long)&pFVar30->face_flags + 3);
          }
        }
        else {
          astring = local_40;
          if (uVar14 == 1) goto LAB_00148b4e;
        }
        pFVar30 = (FT_Face)((long)&local_58->num_faces + (long)&pFVar30->num_faces);
        local_78 = (FT_Face)((long)local_78 - (long)local_58);
        pFVar31 = local_68;
      } while (local_78 != (FT_Face)0x0);
    }
    local_78 = (FT_Face)((long)&pFVar31->num_faces + 1);
    pFVar12 = local_88.face;
    if (local_70 < local_78) goto LAB_00148bf3;
    bVar2 = (byte)pFVar31->num_faces;
    local_58 = (FT_Face)(ulong)bVar2;
    *(uint *)&pfrface[2].available_sizes = (uint)bVar2;
    pFVar12 = local_78;
    if (local_70 < (FT_Face)((long)&local_78->num_faces + (ulong)((uint)bVar2 + (uint)bVar2)))
    goto LAB_00148bf3;
    local_88.face = local_78;
    pvVar19 = ft_mem_realloc((FT_Memory)memory,4,0,(FT_Long)local_58,(void *)0x0,&local_8c);
    *(FT_Pointer *)&pfrface[2].num_charmaps = pvVar19;
    if (local_8c == 0) {
      if (local_58 != (FT_Face)0x0) {
        uVar22 = 0;
        do {
          *(uint *)((long)pvVar19 + uVar22 * 2) =
               (int)(short)((ushort)*(byte *)((long)&local_78->num_faces + uVar22) << 8) |
               (uint)*(byte *)((long)&local_78->num_faces + uVar22 + 1);
          uVar22 = uVar22 + 2;
        } while ((uint)bVar2 + (uint)bVar2 != uVar22);
        local_78 = (FT_Face)((long)&local_78->num_faces + uVar22);
      }
      pFVar29 = &local_78->face_index;
      pFVar12 = local_88.face;
      if (pFVar29 <= local_70) {
        *(uint *)&pfrface[2].charmaps = (uint)(byte)local_78->num_faces;
        *(uint *)((long)&pfrface[2].charmaps + 4) = (uint)*(byte *)((long)&local_78->num_faces + 1);
        uVar24 = *(ushort *)((long)&local_78->num_faces + 2);
        *(uint *)&pfrface[2].face_index = (uint)(ushort)(uVar24 << 8 | uVar24 >> 8);
        uVar24 = *(ushort *)((long)&local_78->num_faces + 4);
        *(uint *)&pfrface[1].internal = (uint)(ushort)(uVar24 << 8 | uVar24 >> 8);
        uVar24 = *(ushort *)((long)&local_78->num_faces + 6);
        uVar24 = uVar24 << 8 | uVar24 >> 8;
        *(uint *)&pfrface[2].generic.data = (uint)uVar24;
        pfrface[2].generic.finalizer =
             (FT_Generic_Finalizer)((long)pFVar29 + ((ulong)uVar36 - (long)stream->cursor));
        uVar33 = (uint)local_48;
        uVar36 = (uint)(local_48 >> 3) & 1;
        uVar22 = (ulong)uVar36;
        local_78 = (FT_Face)(CONCAT44(local_78._4_4_,uVar33) & 0xffffffff00000010);
        local_58 = (FT_Face)(CONCAT44(local_58._4_4_,uVar33) & 0xffffffff00000020);
        pFVar12 = (FT_Face)pFVar29;
        if ((FT_Face)((long)pFVar29 +
                     (ulong)(((local_4c >> 1 | uVar36) +
                              ((uVar33 & 0x20) >> 5) + ((uVar33 & 0x10) >> 4) +
                             (5 - (uint)((local_48 & 2) == 0))) * (uint)uVar24)) <= local_70) {
          local_68 = (FT_Face)CONCAT44(local_68._4_4_,(uint)uVar24);
          local_88.face = (FT_Face)pFVar29;
          pvVar19 = ft_mem_realloc((FT_Memory)memory,0x10,0,(ulong)(uint)uVar24,(void *)0x0,
                                   &local_8c);
          pfrface[2].bbox.xMin = (FT_Pos)pvVar19;
          if (((int)local_68 != 0) && (local_8c == 0)) {
            lVar23 = 0;
            do {
              uVar33 = (uint)(byte)*pFVar29;
              if ((local_48 & 2) == 0) {
                pbVar28 = (byte *)((long)pFVar29 + 1);
              }
              else {
                pbVar28 = (byte *)((long)pFVar29 + 2);
                uVar33 = (uint)CONCAT11((byte)*pFVar29,*(byte *)((long)pFVar29 + 1));
              }
              *(uint *)((long)pvVar19 + lVar23) = uVar33;
              if (local_4c == 0) {
                uVar33 = *(uint *)((long)&pfrface[1].autohint.data + 4);
              }
              else {
                bVar2 = *pbVar28;
                pbVar1 = pbVar28 + 1;
                pbVar28 = pbVar28 + 2;
                uVar33 = (int)(short)((ushort)bVar2 << 8) | (uint)*pbVar1;
              }
              *(uint *)((long)pvVar19 + lVar23 + 4) = uVar33;
              uVar33 = (uint)pbVar28[uVar22];
              if ((int)local_78 == 0) {
                lVar10 = uVar22 + 1;
              }
              else {
                lVar10 = uVar22 + 2;
                uVar33 = (uint)CONCAT11(pbVar28[uVar22],pbVar28[uVar22 + 1]);
              }
              pbVar28 = pbVar28 + lVar10;
              *(uint *)((long)pvVar19 + lVar23 + 8) = uVar33;
              uVar33 = (uint)pbVar28[1];
              if ((int)local_58 == 0) {
                pFVar29 = (FT_Long *)(pbVar28 + 2);
                uVar36 = (uint)*pbVar28 << 8;
              }
              else {
                uVar33 = (uint)pbVar28[1] << 8 | (uint)*pbVar28 << 0x10;
                uVar36 = (uint)pbVar28[2];
                pFVar29 = (FT_Long *)(pbVar28 + 3);
              }
              *(uint *)((long)pvVar19 + lVar23 + 0xc) = uVar36 | uVar33;
              lVar23 = lVar23 + 0x10;
            } while ((ulong)uVar24 * 0x10 != lVar23);
          }
          goto LAB_00148bfb;
        }
      }
      goto LAB_00148bf3;
    }
  }
LAB_00148bfb:
  FT_Stream_ExitFrame(stream);
  FVar16 = FT_Stream_Pos(stream);
  pfrface[2].units_per_EM = (short)FVar16;
  pfrface[2].ascender = (short)(FVar16 >> 0x10);
  pfrface[2].descender = (short)(FVar16 >> 0x20);
  pfrface[2].height = (short)(FVar16 >> 0x30);
  pfrface[2].max_advance_width = 0;
  pfrface[2].max_advance_height = 0;
  pfrface[2].underline_position = 0;
  pfrface[2].underline_thickness = 0;
  local_5c = local_8c;
  if (local_8c != 0) {
    return local_8c;
  }
  pfrface->face_index = (ulong)uVar35;
  uVar35 = *(uint *)&pfrface[2].generic.data;
  uVar22 = (ulong)uVar35;
  uVar21 = pfrface->face_flags | 1;
  pfrface->num_glyphs = uVar22 + 1;
  pfrface->face_flags = uVar21;
  if (uVar22 == 0) {
    uVar26 = 0;
LAB_00148cb8:
    if ((uint)uVar26 != uVar35) goto LAB_00148ccb;
  }
  else {
    piVar32 = (int *)(pfrface[2].bbox.xMin + 0xc);
    uVar26 = 0;
    do {
      if (*piVar32 != 0) goto LAB_00148cb8;
      uVar26 = uVar26 + 1;
      piVar32 = piVar32 + 4;
    } while (uVar22 != uVar26);
  }
  if (*(int *)&pfrface[2].style_name == 0) {
    return 3;
  }
  uVar21 = 0;
LAB_00148ccb:
  uVar35 = *(uint *)&pfrface[1].autohint.data;
  uVar33 = *(uint *)&pfrface[2].style_name;
  uVar26 = (ulong)uVar33;
  uVar22 = (ulong)((uVar35 & 1) << 4) + 0x10 | ~uVar35 & 4 | uVar21;
  pfrface->face_flags = uVar22;
  if (uVar26 != 0) {
    uVar22 = uVar22 | 2;
    pfrface->face_flags = uVar22;
  }
  if ((int)pfrface[2].bbox.yMin != 0) {
    pfrface->face_flags = uVar22 | 0x40;
  }
  pFVar6 = (FT_String *)pfrface[2].num_glyphs;
  pfrface->family_name = pFVar6;
  if (pFVar6 == (FT_String *)0x0) {
    pfrface->family_name = (FT_String *)pfrface[2].style_flags;
  }
  uVar36 = *(uint *)&pfrface[1].driver;
  sVar3 = *(short *)&pfrface[1].sizes_list.tail;
  sVar4 = *(short *)&pfrface[1].stream;
  uVar7 = (uVar36 & 0xffff) * 0xc;
  uVar34 = (int)sVar3 - (int)sVar4;
  if ((int)uVar34 <= (int)(short)((ulong)uVar7 * 0x1999999a >> 0x20)) {
    uVar34 = uVar7 / 10;
  }
  pfrface->style_name = pfrface[2].family_name;
  pfrface->num_fixed_sizes = 0;
  pfrface->available_sizes = (FT_Bitmap_Size *)0x0;
  pFVar8 = pfrface[1].stream;
  (pfrface->bbox).xMin = (FT_Pos)pfrface[1].memory;
  (pfrface->bbox).yMin = (FT_Pos)pFVar8;
  pFVar9 = pfrface[1].sizes_list.tail;
  (pfrface->bbox).xMax = (FT_Pos)pfrface[1].sizes_list.head;
  (pfrface->bbox).yMax = (FT_Pos)pFVar9;
  pfrface->units_per_EM = (FT_UShort)uVar36;
  pfrface->ascender = sVar3;
  pfrface->descender = sVar4;
  pfrface->height = (FT_Short)uVar34;
  if (uVar33 != 0) {
    pFVar18 = (FT_Bitmap_Size *)
              ft_mem_realloc(pfrface->stream->memory,0x20,0,uVar26,(void *)0x0,&local_5c);
    pfrface->available_sizes = pFVar18;
    if (local_5c != 0) {
      return local_5c;
    }
    piVar32 = (int *)(*(long *)&pfrface[2].num_fixed_sizes + 4);
    do {
      iVar20 = *piVar32;
      pFVar18->height = (FT_Short)iVar20;
      iVar5 = piVar32[-1];
      pFVar18->width = (FT_Short)iVar5;
      uVar22 = (ulong)(uint)(iVar20 << 6);
      pFVar18->size = uVar22;
      pFVar18->x_ppem = (ulong)(uint)(iVar5 << 6);
      pFVar18->y_ppem = uVar22;
      pFVar18 = pFVar18 + 1;
      piVar32 = piVar32 + 10;
      uVar35 = (int)uVar26 - 1;
      uVar26 = (ulong)uVar35;
    } while (uVar35 != 0);
    pfrface->num_fixed_sizes = uVar33;
    uVar35 = *(uint *)&pfrface[1].autohint.data;
  }
  if ((uVar35 & 4) == 0) {
    uVar35 = (uint)*(ushort *)((long)&pfrface[1].autohint.data + 4);
  }
  else {
    iVar20 = *(int *)&pfrface[2].generic.data;
    uVar35 = 0;
    if (iVar20 != 0) {
      puVar27 = (uint *)(pfrface[2].bbox.xMin + 4);
      do {
        uVar33 = *puVar27;
        if ((int)*puVar27 < (int)uVar35) {
          uVar33 = uVar35;
        }
        uVar35 = uVar33;
        puVar27 = puVar27 + 4;
        iVar20 = iVar20 + -1;
      } while (iVar20 != 0);
    }
  }
  pfrface->max_advance_width = (FT_Short)uVar35;
  pfrface->max_advance_height = pfrface->height;
  pfrface->underline_position = -(pfrface->units_per_EM / 10);
  pfrface->underline_thickness = pfrface->units_per_EM / 0x1e;
  local_88.encoding = FT_ENCODING_UNICODE;
  local_88.platform_id = 3;
  local_88.encoding_id = 1;
  local_88.face = pfrface;
  FVar15 = FT_CMap_New(&pfr_cmap_class_rec,(FT_Pointer)0x0,&local_88,(FT_CMap_conflict *)0x0);
  if ((int)pfrface[2].bbox.yMin != 0) {
    *(byte *)&pfrface->face_flags = (byte)pfrface->face_flags | 0x40;
  }
  return FVar15;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_face_init( FT_Stream      stream,
                 FT_Face        pfrface,
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    PFR_Face  face = (PFR_Face)pfrface;
    FT_Error  error;

    FT_UNUSED( num_params );
    FT_UNUSED( params );


    FT_TRACE2(( "PFR driver\n" ));

    /* load the header and check it */
    error = pfr_header_load( &face->header, stream );
    if ( error )
      goto Exit;

    if ( !pfr_header_check( &face->header ) )
    {
      FT_TRACE2(( "  not a PFR font\n" ));
      error = FT_THROW( Unknown_File_Format );
      goto Exit;
    }

    /* check face index */
    {
      FT_Long  num_faces;


      error = pfr_log_font_count( stream,
                                  face->header.log_dir_offset,
                                  &num_faces );
      if ( error )
        goto Exit;

      pfrface->num_faces = num_faces;
    }

    if ( face_index < 0 )
      goto Exit;

    if ( ( face_index & 0xFFFF ) >= pfrface->num_faces )
    {
      FT_ERROR(( "pfr_face_init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* load the face */
    error = pfr_log_font_load(
              &face->log_font,
              stream,
              (FT_UInt)( face_index & 0xFFFF ),
              face->header.log_dir_offset,
              FT_BOOL( face->header.phy_font_max_size_high != 0 ) );
    if ( error )
      goto Exit;

    /* now load the physical font descriptor */
    error = pfr_phy_font_load( &face->phy_font, stream,
                               face->log_font.phys_offset,
                               face->log_font.phys_size );
    if ( error )
      goto Exit;

    /* now set up all root face fields */
    {
      PFR_PhyFont  phy_font = &face->phy_font;


      pfrface->face_index = face_index & 0xFFFF;
      pfrface->num_glyphs = (FT_Long)phy_font->num_chars + 1;

      pfrface->face_flags |= FT_FACE_FLAG_SCALABLE;

      /* if gps_offset == 0 for all characters, we  */
      /* assume that the font only contains bitmaps */
      {
        FT_UInt  nn;


        for ( nn = 0; nn < phy_font->num_chars; nn++ )
          if ( phy_font->chars[nn].gps_offset != 0 )
            break;

        if ( nn == phy_font->num_chars )
        {
          if ( phy_font->num_strikes > 0 )
            pfrface->face_flags = 0;        /* not scalable */
          else
          {
            FT_ERROR(( "pfr_face_init: font doesn't contain glyphs\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Exit;
          }
        }
      }

      if ( ( phy_font->flags & PFR_PHY_PROPORTIONAL ) == 0 )
        pfrface->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      if ( phy_font->flags & PFR_PHY_VERTICAL )
        pfrface->face_flags |= FT_FACE_FLAG_VERTICAL;
      else
        pfrface->face_flags |= FT_FACE_FLAG_HORIZONTAL;

      if ( phy_font->num_strikes > 0 )
        pfrface->face_flags |= FT_FACE_FLAG_FIXED_SIZES;

      if ( phy_font->num_kern_pairs > 0 )
        pfrface->face_flags |= FT_FACE_FLAG_KERNING;

      /* If no family name was found in the `undocumented' auxiliary
       * data, use the font ID instead.  This sucks but is better than
       * nothing.
       */
      pfrface->family_name = phy_font->family_name;
      if ( !pfrface->family_name )
        pfrface->family_name = phy_font->font_id;

      /* note that the style name can be NULL in certain PFR fonts,
       * probably meaning `Regular'
       */
      pfrface->style_name = phy_font->style_name;

      pfrface->num_fixed_sizes = 0;
      pfrface->available_sizes = NULL;

      pfrface->bbox         = phy_font->bbox;
      pfrface->units_per_EM = (FT_UShort)phy_font->outline_resolution;
      pfrface->ascender     = (FT_Short) phy_font->bbox.yMax;
      pfrface->descender    = (FT_Short) phy_font->bbox.yMin;

      pfrface->height = (FT_Short)( ( pfrface->units_per_EM * 12 ) / 10 );
      if ( pfrface->height < pfrface->ascender - pfrface->descender )
        pfrface->height = (FT_Short)(pfrface->ascender - pfrface->descender);

      if ( phy_font->num_strikes > 0 )
      {
        FT_UInt          n, count = phy_font->num_strikes;
        FT_Bitmap_Size*  size;
        PFR_Strike       strike;
        FT_Memory        memory = pfrface->stream->memory;


        if ( FT_NEW_ARRAY( pfrface->available_sizes, count ) )
          goto Exit;

        size   = pfrface->available_sizes;
        strike = phy_font->strikes;
        for ( n = 0; n < count; n++, size++, strike++ )
        {
          size->height = (FT_Short)strike->y_ppm;
          size->width  = (FT_Short)strike->x_ppm;
          size->size   = (FT_Pos)( strike->y_ppm << 6 );
          size->x_ppem = (FT_Pos)( strike->x_ppm << 6 );
          size->y_ppem = (FT_Pos)( strike->y_ppm << 6 );
        }
        pfrface->num_fixed_sizes = (FT_Int)count;
      }

      /* now compute maximum advance width */
      if ( ( phy_font->flags & PFR_PHY_PROPORTIONAL ) == 0 )
        pfrface->max_advance_width = (FT_Short)phy_font->standard_advance;
      else
      {
        FT_Int    max = 0;
        FT_UInt   count = phy_font->num_chars;
        PFR_Char  gchar = phy_font->chars;


        for ( ; count > 0; count--, gchar++ )
        {
          if ( max < gchar->advance )
            max = gchar->advance;
        }

        pfrface->max_advance_width = (FT_Short)max;
      }

      pfrface->max_advance_height = pfrface->height;

      pfrface->underline_position  = (FT_Short)( -pfrface->units_per_EM / 10 );
      pfrface->underline_thickness = (FT_Short)(  pfrface->units_per_EM / 30 );

      /* create charmap */
      {
        FT_CharMapRec  charmap;


        charmap.face        = pfrface;
        charmap.platform_id = TT_PLATFORM_MICROSOFT;
        charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        charmap.encoding    = FT_ENCODING_UNICODE;

        error = FT_CMap_New( &pfr_cmap_class_rec, NULL, &charmap, NULL );
      }

      /* check whether we have loaded any kerning pairs */
      if ( phy_font->num_kern_pairs )
        pfrface->face_flags |= FT_FACE_FLAG_KERNING;
    }

  Exit:
    return error;
  }